

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.h
# Opt level: O3

WId __thiscall QWidget::effectiveWinId(QWidget *this)

{
  WId WVar1;
  
  WVar1 = this->data->winid;
  if (WVar1 == 0) {
    if ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) == 0) {
      return 0;
    }
    do {
      this = *(QWidget **)(*(long *)&this->field_0x8 + 0x10);
      if (this == (QWidget *)0x0) {
        return 0;
      }
      WVar1 = this->data->winid;
    } while (WVar1 == 0);
  }
  return WVar1;
}

Assistant:

inline WId internalWinId() const { return data->winid; }